

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_delete(char *_fname)

{
  long lVar1;
  void *pvVar2;
  _func_int_void_ptr_char_ptr *p_Var3;
  DirHandle *pDVar4;
  ulong *puVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ulong *puVar9;
  ulong *puVar10;
  size_t sVar11;
  PHYSFS_ErrorCode errcode;
  bool bVar12;
  ulong uStack_38;
  ulong *local_30;
  
  puVar10 = &uStack_38;
  __PHYSFS_platformGrabMutex(stateLock);
  pDVar4 = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    errcode = PHYSFS_ERR_NO_WRITE_DIR;
  }
  else {
    sVar8 = strlen(_fname);
    lVar1 = pDVar4->rootlen + sVar8;
    if (sVar8 + pDVar4->rootlen + 1 < 0x100) {
      puVar9 = (ulong *)((long)&uStack_38 - (lVar1 + 0x18U & 0xfffffffffffffff0));
      puVar10 = puVar9;
    }
    else {
      puVar9 = (ulong *)0x0;
      puVar10 = &uStack_38;
    }
    bVar12 = puVar9 == (ulong *)0x0;
    if (bVar12) {
      puVar10[-1] = 0x108a31;
      puVar9 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(lVar1 + 9);
    }
    pDVar4 = writeDir;
    if (puVar9 == (ulong *)0x0) {
      puVar9 = (ulong *)0x0;
    }
    else {
      *puVar9 = (ulong)bVar12;
      puVar9 = puVar9 + 1;
    }
    if (puVar9 != (ulong *)0x0) {
      iVar7 = 0;
      if (writeDir == (DirHandle *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = writeDir->rootlen;
      }
      local_30 = puVar9;
      puVar10[-1] = 0x108a8e;
      iVar6 = sanitizePlatformIndependentPath(_fname,(char *)(sVar11 + (long)puVar9));
      if (iVar6 != 0) {
        iVar7 = 0;
        puVar10[-1] = 0x108aa3;
        iVar6 = verifyPath(pDVar4,(char **)&local_30,0);
        puVar5 = local_30;
        if (iVar6 != 0) {
          pvVar2 = pDVar4->opaque;
          p_Var3 = pDVar4->funcs->remove;
          puVar10[-1] = 0x108ab7;
          iVar7 = (*p_Var3)(pvVar2,(char *)puVar5);
        }
      }
      puVar10[-1] = 0x108ac6;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (puVar9[-1] == 0) {
        return iVar7;
      }
      puVar10[-1] = 0x108ada;
      (*__PHYSFS_AllocatorHooks.Free)(puVar9 + -1);
      return iVar7;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  *(undefined8 *)((long)puVar10 + -8) = 0x108a70;
  PHYSFS_setErrorCode(errcode);
  *(undefined8 *)((long)puVar10 + -8) = 0x108a7c;
  __PHYSFS_platformReleaseMutex(stateLock);
  return 0;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    __PHYSFS_platformGrabMutex(stateLock);
    BAIL_IF_MUTEX(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);
    len = strlen(_fname) + dirHandleRootLen(writeDir) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(fname);
    return retval;
}